

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_> *
libtorrent::aux::parse_listen_interfaces
          (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
           *__return_storage_ptr__,string *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  void *pvVar3;
  uint uVar4;
  aux *paVar5;
  size_t sVar7;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  aux *paVar8;
  size_t in_R8;
  aux *this;
  long lVar9;
  char *pcVar10;
  size_type __n;
  size_t sVar11;
  size_t sVar12;
  undefined8 uVar13;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  string_view in_04;
  string_view sVar14;
  string_view sVar15;
  string_view last;
  string port_str;
  listen_interface_t iface;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  char *local_80;
  long local_78;
  char local_70;
  undefined7 uStack_6f;
  listen_interface_t local_60;
  pointer local_38;
  char *pcVar6;
  char *extraout_RDX;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (aux *)in->_M_string_length;
  local_90 = (vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
              *)__return_storage_ptr__;
  if (this != (aux *)0x0) {
    uVar13 = (in->_M_dataplus)._M_p;
    paVar1 = &local_60.device.field_2;
    local_88 = err;
    do {
      local_a8 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
      last._M_str = (char *)0x2c;
      last._M_len = uVar13;
      split_string_quotes((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&local_60,this,last,(char)in_R8);
      uVar13 = local_60.device.field_2._8_8_;
      local_a8._M_str = (char *)local_60.device._M_string_length;
      local_a8._M_len = (size_t)local_60.device._M_dataplus._M_p;
      this = (aux *)CONCAT71(local_60.device.field_2._M_allocated_capacity._1_7_,
                             local_60.device.field_2._M_local_buf[0]);
      sVar14._M_str = extraout_RDX;
      sVar14._M_len = local_60.device._M_string_length;
      local_a8 = (basic_string_view<char,_std::char_traits<char>_>)
                 strip_string((aux *)local_60.device._M_dataplus._M_p,sVar14);
      pcVar10 = local_a8._M_str;
      uVar2 = local_a8._M_len;
      if (((1 < uVar2) && (*pcVar10 == '\"')) && (pcVar10[uVar2 - 1] == '\"')) {
        local_a8._M_len = uVar2 - 1;
        if (uVar2 - 2 <= uVar2 - 1) {
          local_a8._M_len = uVar2 - 2;
        }
        local_a8._M_str = pcVar10 + 1;
      }
      paVar5 = (aux *)local_a8._M_len;
      if ((aux *)local_a8._M_len != (aux *)0x0) {
        local_38 = (pointer)uVar13;
        local_60.device._M_string_length = 0;
        local_60.device.field_2._M_local_buf[0] = '\0';
        local_60.ssl = false;
        local_60.local = false;
        pcVar10 = local_a8._M_str;
        local_60.device._M_dataplus._M_p = (pointer)paVar1;
        if (*local_a8._M_str == '[') {
          pvVar3 = memchr(local_a8._M_str,0x5d,local_a8._M_len);
          lVar9 = (long)pvVar3 - (long)pcVar10;
          if (((lVar9 == -1 || pvVar3 == (void *)0x0) || (paVar5 <= (aux *)(lVar9 + 1U))) ||
             (pcVar10[(long)(lVar9 + 1U)] != ':')) {
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88
                       ,&local_a8);
          }
          else {
            paVar8 = paVar5 + -1;
            if ((aux *)(lVar9 - 1U) <= paVar5 + -1) {
              paVar8 = (aux *)(lVar9 - 1U);
            }
            in_00._M_str = extraout_RDX_00;
            in_00._M_len = (size_t)(pcVar10 + 1);
            sVar14 = strip_string(paVar8,in_00);
            sVar7 = sVar14._M_len;
            ::std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)sVar14._M_str);
            pcVar10 = (char *)(lVar9 + 2);
            if (local_a8._M_len < pcVar10) {
              ::std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",pcVar10);
            }
            in_01._M_str = extraout_RDX_01;
            in_01._M_len = (size_t)(pcVar10 + (long)local_a8._M_str);
            pcVar6 = (char *)local_a8._M_len;
            sVar14 = strip_string((aux *)(local_a8._M_len + -(long)pcVar10),in_01);
            sVar15._M_str = pcVar6;
            sVar15._M_len = sVar7;
LAB_003132d1:
            sVar7 = sVar15._M_len;
            sVar11 = sVar14._M_len;
            pcVar10 = &local_70;
            local_78 = 0;
            local_70 = '\0';
            local_80 = pcVar10;
            if (sVar11 != 0) {
              sVar12 = 0;
              do {
                uVar4 = (int)CONCAT71((int7)((ulong)pcVar10 >> 8),sVar14._M_str[sVar12]) - 0x30;
                pcVar6 = (char *)(ulong)uVar4;
                sVar15._M_str._0_4_ = uVar4;
                sVar15._M_len = sVar7;
                sVar15._M_str._4_4_ = 0;
                if (9 < (byte)uVar4) break;
                pcVar10 = (char *)::std::__cxx11::string::push_back((char)&local_80);
                sVar15._M_str = pcVar6;
                sVar15._M_len = sVar7;
                sVar12 = sVar12 + 1;
              } while (sVar11 != sVar12);
            }
            lVar9 = local_78;
            in_R8 = sVar15._M_len;
            if (local_78 - 6U < 0xfffffffffffffffb) {
LAB_00313337:
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_88,&local_a8);
            }
            else {
              local_60.port = atoi(local_80);
              in_R8 = sVar15._M_len;
              if (0xffff < (uint)local_60.port) goto LAB_00313337;
              in_04._M_str = extraout_RDX_03;
              in_04._M_len = (size_t)(sVar14._M_str + lVar9);
              sVar14 = strip_string((aux *)(sVar11 - lVar9),in_04);
              in_R8 = sVar15._M_len;
              if (sVar14._M_len != 0) {
                sVar7 = 0;
                do {
                  if (sVar14._M_str[sVar7] == 'l') {
                    local_60.local = true;
                  }
                  else if (sVar14._M_str[sVar7] == 's') {
                    local_60.ssl = true;
                  }
                  sVar7 = sVar7 + 1;
                } while (sVar14._M_len != sVar7);
              }
              ::std::
              vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
              ::emplace_back<libtorrent::aux::listen_interface_t&>(local_90,&local_60);
            }
            if (local_80 != &local_70) {
              operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
            }
          }
        }
        else {
          pvVar3 = memchr(local_a8._M_str,0x3a,local_a8._M_len);
          paVar8 = (aux *)(-(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar10);
          if (paVar8 <= paVar5) {
            paVar5 = paVar8;
          }
          in_02._M_str = extraout_RDX_02;
          in_02._M_len = (size_t)pcVar10;
          sVar15 = strip_string(paVar5,in_02);
          ::std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)sVar15._M_str);
          sVar7 = sVar15._M_len;
          if (paVar8 == (aux *)0xffffffffffffffff) {
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88
                       ,&local_a8);
            sVar14 = (string_view)ZEXT816(0);
          }
          else {
            if (local_a8._M_len <= paVar8) {
              ::std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr");
            }
            paVar5 = (aux *)(local_a8._M_len + -(long)(paVar8 + 1));
            in_03._M_str = paVar8 + 1 + (long)local_a8._M_str;
            in_03._M_len = (size_t)in_03._M_str;
            sVar14 = strip_string(paVar5,in_03);
            sVar15._M_str = (char *)paVar5;
            sVar15._M_len = sVar7;
          }
          in_R8 = sVar15._M_len;
          if (paVar8 != (aux *)0xffffffffffffffff) goto LAB_003132d1;
        }
        uVar13 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.device._M_dataplus._M_p != paVar1) {
          operator_delete(local_60.device._M_dataplus._M_p,
                          CONCAT71(local_60.device.field_2._M_allocated_capacity._1_7_,
                                   local_60.device.field_2._M_local_buf[0]) + 1);
          uVar13 = local_38;
        }
      }
    } while (this != (aux *)0x0);
  }
  return (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
          *)local_90;
}

Assistant:

std::vector<listen_interface_t> parse_listen_interfaces(std::string const& in
		, std::vector<std::string>& err)
	{
		std::vector<listen_interface_t> out;

		string_view rest = in;
		while (!rest.empty())
		{
			string_view element;
			std::tie(element, rest) = split_string_quotes(rest, ',');

			element = strip_string(element);
			if (element.size() > 1 && element.front() == '"' && element.back() == '"')
				element = element.substr(1, element.size() - 2);
			if (element.empty()) continue;

			listen_interface_t iface;
			iface.ssl = false;
			iface.local = false;

			string_view port;
			if (element.front() == '[')
			{
				auto const pos = element.find_first_of(']', 0);
				if (pos == string_view::npos
					|| pos+1 >= element.size()
					|| element[pos+1] != ':')
				{
					err.emplace_back(element);
					continue;
				}

				iface.device = strip_string(element.substr(1, pos - 1));

				port = strip_string(element.substr(pos + 2));
			}
			else
			{
				// consume device name
				auto const pos = element.find_first_of(':', 0);
				iface.device = strip_string(element.substr(0, pos));
				if (pos == string_view::npos)
				{
					err.emplace_back(element);
					continue;
				}
				port = strip_string(element.substr(pos + 1));
			}

			// consume port
			std::string port_str;
			for (std::size_t i = 0; i < port.size() && is_digit(port[i]); ++i)
				port_str += port[i];

			if (port_str.empty() || port_str.size() > 5)
			{
				err.emplace_back(element);
				continue;
			}

			iface.port = std::atoi(port_str.c_str());
			if (iface.port < 0 || iface.port > 65535)
			{
				err.emplace_back(element);
				continue;
			}

			port.remove_prefix(port_str.size());
			port = strip_string(port);

			// consume potential SSL 's'
			for (auto const c : port)
			{
				switch (c)
				{
					case 's': iface.ssl = true; break;
					case 'l': iface.local = true; break;
				}
			}

			TORRENT_ASSERT(iface.port >= 0);
			out.emplace_back(iface);
		}

		return out;
	}